

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Platform.cpp
# Opt level: O0

uint8_t __thiscall
GmmLib::PlatformInfoGen11::CheckFmtDisplayDecompressible
          (PlatformInfoGen11 *this,GMM_TEXTURE_INFO *Surf,bool IsSupportedRGB64_16_16_16_16,
          bool IsSupportedRGB32_8_8_8_8,bool IsSupportedRGB32_2_10_10_10,
          bool IsSupportedMediaFormats)

{
  bool bVar1;
  GMM_PLATFORM_INFO *pGVar2;
  uint8_t local_3d;
  uint8_t local_1e;
  bool IsMediaCompressed;
  bool IsRenderCompressed;
  bool IsSupportedMediaFormats_local;
  bool IsSupportedRGB32_2_10_10_10_local;
  bool IsSupportedRGB32_8_8_8_8_local;
  bool IsSupportedRGB64_16_16_16_16_local;
  GMM_TEXTURE_INFO *Surf_local;
  PlatformInfoGen11 *this_local;
  
  bVar1 = false;
  local_1e = '\0';
  pGVar2 = Context::GetPlatformInfo
                     ((this->super_PlatformInfoGen10).super_PlatformInfo.pGmmLibContext);
  if ((pGVar2->Platform).eProductFamily == IGFX_LAKEFIELD) {
    if (((((ulong)(Surf->Flags).Gpu >> 0x10 & 1) != 0) &&
        (((ulong)(Surf->Flags).Info >> 0x24 & 1) != 0)) &&
       ((Surf->Format == GMM_FORMAT_NV12 || (Surf->Format == GMM_FORMAT_P010)))) {
      local_1e = '\x01';
    }
    if (((IsSupportedRGB64_16_16_16_16) || (IsSupportedRGB32_8_8_8_8)) ||
       (IsSupportedRGB32_2_10_10_10)) {
      bVar1 = true;
    }
  }
  else if ((IsSupportedRGB32_8_8_8_8) ||
          ((pGVar2 = Context::GetPlatformInfo
                               ((this->super_PlatformInfoGen10).super_PlatformInfo.pGmmLibContext),
           (pGVar2->Platform).eProductFamily == IGFX_ICELAKE && (IsSupportedRGB64_16_16_16_16)))) {
    bVar1 = true;
  }
  local_3d = '\x01';
  if (!bVar1) {
    local_3d = local_1e;
  }
  return local_3d;
}

Assistant:

uint8_t GmmLib::PlatformInfoGen11::CheckFmtDisplayDecompressible(GMM_TEXTURE_INFO &Surf,
                                                                 bool              IsSupportedRGB64_16_16_16_16,
                                                                 bool              IsSupportedRGB32_8_8_8_8,
                                                                 bool              IsSupportedRGB32_2_10_10_10,
                                                                 bool              IsSupportedMediaFormats)
{
    bool IsRenderCompressed = false;
    bool IsMediaCompressed  = false;
    GMM_UNREFERENCED_PARAMETER(IsSupportedMediaFormats);

    if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_LAKEFIELD)
    {
        if(Surf.Flags.Gpu.MMC &&
           Surf.Flags.Info.TiledY &&
           (Surf.Format == GMM_FORMAT_NV12 ||
            Surf.Format == GMM_FORMAT_P010))
        {
            IsMediaCompressed = true;
        }

        if(IsSupportedRGB64_16_16_16_16 || //RGB64 16:16 : 16 : 16 FP16
           IsSupportedRGB32_8_8_8_8 ||     //RGB32 8 : 8 : 8 : 8
           IsSupportedRGB32_2_10_10_10)    //RGB32 2 : 10 : 10 : 10
        {
            IsRenderCompressed = true;
        }
    }
    else
    {
        // Pre-LKF1
        if(IsSupportedRGB32_8_8_8_8 || //RGB32 8 : 8 : 8 : 8
           (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_ICELAKE &&
            IsSupportedRGB64_16_16_16_16)) //RGB64 16:16 : 16 : 16 FP16
        {
            IsRenderCompressed = true;
        }
    }
    return IsRenderCompressed || IsMediaCompressed;
}